

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void __thiscall ON_RenderContent::ON_RenderContent(ON_RenderContent *this,wchar_t *kind)

{
  ON_RenderContentPrivate *pOVar1;
  ON_XMLVariant local_238;
  ON_UUID local_140;
  ON_XMLVariant local_130;
  undefined1 local_34 [8];
  ON_UUID uuid;
  wchar_t *kind_local;
  ON_RenderContent *this_local;
  
  ON_ModelComponent::ON_ModelComponent(&this->super_ON_ModelComponent,RenderContent);
  (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b77938;
  ON_RenderContentPrivate::ON_RenderContentPrivate
            ((ON_RenderContentPrivate *)this->_PRIVATE,this,kind);
  this->_private = (ON_RenderContentPrivate *)this->_PRIVATE;
  ON_CreateUuid((ON_UUID *)local_34);
  ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)local_34);
  pOVar1 = this->_private;
  local_140 = RdkPlugInId();
  ::ON_XMLVariant::ON_XMLVariant(&local_130,&local_140);
  ON_RenderContentPrivate::InternalSetPropertyValue(pOVar1,L"plug-in-id",&local_130);
  ::ON_XMLVariant::~ON_XMLVariant(&local_130);
  pOVar1 = this->_private;
  ::ON_XMLVariant::ON_XMLVariant(&local_238,&ON_UniversalRenderEngineId);
  ON_RenderContentPrivate::InternalSetPropertyValue(pOVar1,L"render-engine-id",&local_238);
  ::ON_XMLVariant::~ON_XMLVariant(&local_238);
  return;
}

Assistant:

ON_RenderContent::ON_RenderContent(const wchar_t* kind)
  :
  ON_ModelComponent(ON_ModelComponent::Type::RenderContent)
{
  _private = new (_PRIVATE) ON_RenderContentPrivate(*this, kind); PRIVATE_CHECK(ON_RenderContentPrivate);

  // Set a unique instance id.
  ON_UUID uuid;
  ON_CreateUuid(uuid);
  SetId(uuid);

  // Set the plug-in id to the RDK plug-in id.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_PLUG_IN_ID, RdkPlugInId());

  // Set the render engine id to 'universal'.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_RENDER_ENGINE_ID, ON_UniversalRenderEngineId);
}